

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

int luaK_numberK(FuncState *fs,lua_Number r)

{
  int iVar1;
  int iVar2;
  int n;
  TValue *io_2;
  lua_Integer ik;
  lua_Number k;
  lua_Number q;
  TValue **ppTStack_50;
  int nbm;
  TValue *io_1;
  TValue *io;
  TValue kv;
  TValue o;
  lua_Number r_local;
  FuncState *fs_local;
  
  io_1 = (TValue *)&kv.tt_;
  kv._8_8_ = r;
  if ((r != 0.0) || (NAN(r))) {
    q._4_4_ = 0x35;
    k = ldexp(1.0,-0x34);
    ik = (lua_Integer)(r * (k + 1.0));
    kv.value_.ub = '\x13';
    io = (TValue *)ik;
    iVar1 = luaV_flttointeger((lua_Number)ik,(lua_Integer *)&io_2,F2Ieq);
    if (iVar1 == 0) {
      iVar1 = k2proto(fs,(TValue *)&io,(TValue *)&kv.tt_);
      iVar2 = luaV_equalobj((lua_State *)0x0,fs->f->k + iVar1,(TValue *)&kv.tt_);
      if (iVar2 != 0) {
        return iVar1;
      }
    }
    fs_local._4_4_ = addk(fs,fs->f,(TValue *)&kv.tt_);
  }
  else {
    ppTStack_50 = &io;
    io = (TValue *)fs;
    fs_local._4_4_ = k2proto(fs,(TValue *)&io,(TValue *)&kv.tt_);
  }
  return fs_local._4_4_;
}

Assistant:

static int luaK_numberK (FuncState *fs, lua_Number r) {
  TValue o, kv;
  setfltvalue(&o, r);  /* value as a TValue */
  if (r == 0) {  /* handle zero as a special case */
    setpvalue(&kv, fs);  /* use FuncState as index */
    return k2proto(fs, &kv, &o);  /* cannot collide */
  }
  else {
    const int nbm = l_floatatt(MANT_DIG);
    const lua_Number q = l_mathop(ldexp)(l_mathop(1.0), -nbm + 1);
    const lua_Number k =  r * (1 + q);  /* key */
    lua_Integer ik;
    setfltvalue(&kv, k);  /* key as a TValue */
    if (!luaV_flttointeger(k, &ik, F2Ieq)) {  /* not an integral value? */
      int n = k2proto(fs, &kv, &o);  /* use key */
      if (luaV_rawequalobj(&fs->f->k[n], &o))  /* correct value? */
        return n;
    }
    /* else, either key is still an integer or there was a collision;
       anyway, do not try to reuse constant; instead, create a new one */
    return addk(fs, fs->f, &o);
  }
}